

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLURL.cpp
# Opt level: O3

BinInputStream * __thiscall xercesc_4_0::XMLURL::makeNewStream(XMLURL *this)

{
  ulong fromIndex;
  short *psVar1;
  ulong uVar2;
  XMLCh XVar3;
  XMLCh XVar4;
  MemoryManager *manager;
  XMLCh *__src;
  int iVar5;
  BinInputStream *pBVar6;
  char16_t *toDelete;
  long lVar7;
  ulong uVar8;
  BinFileInputStream *this_00;
  MalformedURLException *pMVar9;
  short sVar10;
  short sVar11;
  size_t __n;
  ulong uVar12;
  ArrayJanitor<char16_t> basePathName;
  XMLCh value1 [4];
  ArrayJanitor<char16_t> local_48;
  XMLCh local_38;
  undefined2 uStack_36;
  XMLCh local_34;
  undefined2 local_32;
  undefined4 extraout_var;
  
  if ((this->fProtocol != File) ||
     ((this->fHost != (XMLCh *)0x0 &&
      (iVar5 = XMLString::compareIStringASCII(this->fHost,(XMLCh *)XMLUni::fgLocalHostString),
      iVar5 != 0)))) {
    if (XMLPlatformUtils::fgNetAccessor != (long *)0x0) {
      pBVar6 = (BinInputStream *)
               (**(code **)(*XMLPlatformUtils::fgNetAccessor + 0x18))
                         (XMLPlatformUtils::fgNetAccessor,this,0);
      return pBVar6;
    }
    pMVar9 = (MalformedURLException *)__cxa_allocate_exception(0x30);
    MalformedURLException::MalformedURLException
              (pMVar9,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLURL.cpp"
               ,0x29f,URL_UnsupportedProto,this->fMemoryManager);
    __cxa_throw(pMVar9,&MalformedURLException::typeinfo,XMLException::~XMLException);
  }
  manager = this->fMemoryManager;
  __src = this->fPath;
  if (__src == (XMLCh *)0x0) {
    ArrayJanitor<char16_t>::ArrayJanitor(&local_48,(char16_t *)0x0,manager);
  }
  else {
    __n = 0;
    do {
      psVar1 = (short *)((long)__src + __n);
      __n = __n + 2;
    } while (*psVar1 != 0);
    iVar5 = (*manager->_vptr_MemoryManager[3])(manager,__n);
    toDelete = (char16_t *)CONCAT44(extraout_var,iVar5);
    memcpy(toDelete,__src,__n);
    ArrayJanitor<char16_t>::ArrayJanitor(&local_48,toDelete,this->fMemoryManager);
    if (toDelete != (char16_t *)0x0) {
      lVar7 = 0;
      do {
        psVar1 = (short *)((long)toDelete + lVar7);
        lVar7 = lVar7 + 2;
      } while (*psVar1 != 0);
      uVar12 = (lVar7 >> 1) - 1;
      goto LAB_00257ea0;
    }
  }
  toDelete = (XMLCh *)0x0;
  uVar12 = 0;
LAB_00257ea0:
  iVar5 = XMLString::indexOf(toDelete,L'%',0,this->fMemoryManager);
  do {
    if (iVar5 == -1) {
LAB_00257fd4:
      this_00 = (BinFileInputStream *)XMemory::operator_new(0x18,this->fMemoryManager);
      BinFileInputStream::BinFileInputStream(this_00,toDelete,this->fMemoryManager);
      if (this_00->fSource == (FileHandle)0x0) {
        (*(this_00->super_BinInputStream)._vptr_BinInputStream[1])(this_00);
        this_00 = (BinFileInputStream *)0x0;
      }
      ArrayJanitor<char16_t>::~ArrayJanitor(&local_48);
      return &this_00->super_BinInputStream;
    }
    lVar7 = (long)iVar5;
    if ((int)uVar12 <= iVar5 + 2) {
      uStack_36 = 0;
      local_34 = 0;
      memmove(&local_38,toDelete + lVar7,(ulong)(iVar5 + 1 < (int)uVar12) * 2 + 2);
      pMVar9 = (MalformedURLException *)__cxa_allocate_exception(0x30);
      MalformedURLException::MalformedURLException
                (pMVar9,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLURL.cpp"
                 ,0x271,XMLNUM_URI_Component_Invalid_EscapeSequence,toDelete,&local_38,(XMLCh *)0x0,
                 (XMLCh *)0x0,this->fMemoryManager);
      __cxa_throw(pMVar9,&MalformedURLException::typeinfo,XMLException::~XMLException);
    }
    XVar3 = toDelete[lVar7 + 1];
    if ((9 < (ushort)(XVar3 + L'￐')) &&
       ((0x25 < (ushort)XVar3 - 0x41 ||
        ((0x3f0000003fU >> ((ulong)((ushort)XVar3 - 0x41) & 0x3f) & 1) == 0)))) {
LAB_002580e8:
      local_34 = toDelete[lVar7 + 2];
      local_38 = (XMLCh)*(undefined4 *)(toDelete + lVar7);
      uStack_36 = (undefined2)((uint)*(undefined4 *)(toDelete + lVar7) >> 0x10);
      local_32 = 0;
      pMVar9 = (MalformedURLException *)__cxa_allocate_exception(0x30);
      MalformedURLException::MalformedURLException
                (pMVar9,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLURL.cpp"
                 ,0x27c,XMLNUM_URI_Component_Invalid_EscapeSequence,toDelete,&local_38,(XMLCh *)0x0,
                 (XMLCh *)0x0,this->fMemoryManager);
      __cxa_throw(pMVar9,&MalformedURLException::typeinfo,XMLException::~XMLException);
    }
    XVar4 = toDelete[iVar5 + 2];
    if ((9 < (ushort)(XVar4 + L'￐')) &&
       ((0x25 < (ushort)XVar4 - 0x41 ||
        ((0x3f0000003fU >> ((ulong)((ushort)XVar4 - 0x41) & 0x3f) & 1) == 0)))) goto LAB_002580e8;
    fromIndex = lVar7 + 1;
    sVar11 = (ushort)((ushort)(XVar3 + L'﾿') < 6) * 0x20 + 0xfa9;
    if ((ushort)(XVar3 + L'￐') < 10) {
      sVar11 = 0xfd0;
    }
    sVar10 = (ushort)((ushort)(XVar4 + L'﾿') < 6) * 0x20 + -0x57;
    if ((ushort)(XVar4 + L'￐') < 10) {
      sVar10 = -0x30;
    }
    toDelete[lVar7] = sVar10 + XVar4 + (sVar11 + XVar3) * 0x10;
    uVar2 = uVar12 - 2;
    if (uVar2 <= fromIndex) {
      toDelete[fromIndex] = L'\0';
      goto LAB_00257fd4;
    }
    uVar8 = lVar7 + 3;
    do {
      toDelete[uVar8 - 2] = toDelete[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar12 != uVar8);
    toDelete[uVar2] = L'\0';
    if (uVar2 <= fromIndex) goto LAB_00257fd4;
    iVar5 = XMLString::indexOf(toDelete,L'%',fromIndex,this->fMemoryManager);
    uVar12 = uVar2;
  } while( true );
}

Assistant:

BinInputStream* XMLURL::makeNewStream() const
{
    //
    //  If its a local host, then we short circuit it and use our own file
    //  stream support. Otherwise, we just let it fall through and let the
    //  installed network access object provide a stream.
    //
    if (fProtocol == XMLURL::File)
    {
        if (!fHost || !XMLString::compareIStringASCII(fHost, XMLUni::fgLocalHostString))
        {

            XMLCh* realPath = XMLString::replicate(fPath, fMemoryManager);
            ArrayJanitor<XMLCh> basePathName(realPath, fMemoryManager);

            //
            // Need to manually replace any character reference %xx first
            // HTTP protocol will be done automatically by the netaccessor
            //
            XMLSize_t end = XMLString::stringLen(realPath);
            int percentIndex = XMLString::indexOf(realPath, chPercent, 0, fMemoryManager);

            while (percentIndex != -1) {

            	// Isolate the length/boundary check so we don't try and copy off the end.
                if (percentIndex+2 >= (int)end)
                {
                    XMLCh value1[3];
                    value1[1] = chNull;
                    value1[2] = chNull;
					XMLString::moveChars(value1, &(realPath[percentIndex]), (percentIndex + 1 >= (int)end ? 1 : 2));
                    ThrowXMLwithMemMgr2(MalformedURLException
                            , XMLExcepts::XMLNUM_URI_Component_Invalid_EscapeSequence
                            , realPath
                            , value1
                            , fMemoryManager);
                }
                else if (!isHexDigit(realPath[percentIndex+1]) || !isHexDigit(realPath[percentIndex+2]))
                {
                    XMLCh value1[4];
                    XMLString::moveChars(value1, &(realPath[percentIndex]), 3);
                    value1[3] = chNull;
                    ThrowXMLwithMemMgr2(MalformedURLException
                            , XMLExcepts::XMLNUM_URI_Component_Invalid_EscapeSequence
                            , realPath
                            , value1
                            , fMemoryManager);
                }

                unsigned int value = (xlatHexDigit(realPath[percentIndex+1]) * 16) + xlatHexDigit(realPath[percentIndex+2]);

                realPath[percentIndex] = XMLCh(value);

                XMLSize_t i =0;
                for (i = percentIndex + 1; i < end - 2 ; i++)
                    realPath[i] = realPath[i+2];
                realPath[i] = chNull;
                end = i;

                if (((XMLSize_t)(percentIndex + 1)) < end)
                  percentIndex = XMLString::indexOf(realPath, chPercent, percentIndex + 1, fMemoryManager);
                else
                  percentIndex = -1;
            }


            BinFileInputStream* retStrm = new (fMemoryManager) BinFileInputStream(realPath, fMemoryManager);
            if (!retStrm->getIsOpen())
            {
                delete retStrm;
                return 0;
            }
            return retStrm;
        }
    }

    //
    //  If we don't have have an installed net accessor object, then we
    //  have to just throw here.
    //
    if (!XMLPlatformUtils::fgNetAccessor)
        ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_UnsupportedProto, fMemoryManager);

    // Else ask the net accessor to create the stream
    return XMLPlatformUtils::fgNetAccessor->makeNew(*this);
}